

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_ARB1_destarg_string(Context *ctx,char *buf,size_t buflen)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t in_R8;
  char *pcVar5;
  char *pcVar6;
  char writemask_str [6];
  char regnum_str [16];
  
  *buf = '\0';
  uVar1 = (ctx->dest_arg).result_mod;
  pcVar6 = "";
  pcVar5 = "";
  if ((uVar1 & 1) != 0) {
    if (ctx->profile_supports_nv4 == 0) {
      pcVar5 = "";
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        pcVar5 = "_SAT";
      }
    }
    else {
      pcVar5 = ".SAT";
    }
  }
  if (((uVar1 & 2) != 0) && (pcVar6 = "H", ctx->profile_supports_nv4 == 0)) {
    pcVar6 = "";
  }
  if ((uVar1 & 4) == 0) {
    pcVar3 = get_D3D_register_string
                       (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,regnum_str,in_R8);
    if (pcVar3 == (char *)0x0) {
      pcVar5 = "Unknown destination register type.";
    }
    else {
      iVar2 = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
      if ((iVar2 == 0) && ((ctx->dest_arg).writemask != 0xf)) {
        writemask_str[0] = '.';
        if ((ctx->dest_arg).writemask0 == 0) {
          lVar4 = 1;
        }
        else {
          writemask_str[1] = 'x';
          lVar4 = 2;
        }
        if ((ctx->dest_arg).writemask1 != 0) {
          writemask_str[lVar4] = 'y';
          lVar4 = lVar4 + 1;
        }
        if ((ctx->dest_arg).writemask2 != 0) {
          writemask_str[lVar4] = 'z';
          lVar4 = lVar4 + 1;
        }
        if ((ctx->dest_arg).writemask3 != 0) {
          writemask_str[lVar4] = 'w';
          lVar4 = lVar4 + 1;
        }
      }
      else {
        lVar4 = 0;
      }
      writemask_str[lVar4] = '\0';
      if (ctx->predicated == 0) {
        snprintf(buf,0x40,"%s%s %s%s%s",pcVar6,pcVar5,pcVar3,regnum_str,writemask_str);
        return buf;
      }
      pcVar5 = "dest register predication currently unsupported in arb1";
    }
    failf(ctx,"%s",pcVar5);
    return buf;
  }
  __assert_fail("(arg->result_mod & MOD_CENTROID) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1a1d,"const char *make_ARB1_destarg_string(Context *, char *, const size_t)");
}

Assistant:

static const char *make_ARB1_destarg_string(Context *ctx, char *buf,
                                            const size_t buflen)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    *buf = '\0';

    const char *sat_str = "";
    if (arg->result_mod & MOD_SATURATE)
    {
        // nv4 can use ".SAT" in all program types.
        // For less than nv4, the "_SAT" modifier is only available in
        //  fragment shaders. Every thing else will fake it later in
        //  emit_ARB1_dest_modifiers() ...
        if (support_nv4(ctx))
            sat_str = ".SAT";
        else if (shader_is_pixel(ctx))
            sat_str = "_SAT";
    } // if

    const char *pp_str = "";
    if (arg->result_mod & MOD_PP)
    {
        // Most ARB1 profiles can't do partial precision (MOD_PP), but that's
        //  okay. The spec says lots of Direct3D implementations ignore the
        //  flag anyhow.
        if (support_nv4(ctx))
            pp_str = "H";
    } // if

    // CENTROID only allowed in DCL opcodes, which shouldn't come through here.
    assert((arg->result_mod & MOD_CENTROID) == 0);

    char regnum_str[16];
    const char *regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                                       arg->regnum, regnum_str,
                                                       sizeof (regnum_str));
    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown destination register type.");
        return buf;
    } // if

    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    //const char *pred_left = "";
    //const char *pred_right = "";
    char pred[32] = { '\0' };
    if (ctx->predicated)
    {
        fail(ctx, "dest register predication currently unsupported in arb1");
        return buf;
        //pred_left = "(";
        //pred_right = ") ";
        make_ARB1_srcarg_string_in_buf(ctx, &ctx->predicate_arg,
                                       pred, sizeof (pred));
    } // if

    snprintf(buf, buflen, "%s%s %s%s%s", pp_str, sat_str,
             regtype_str, regnum_str, writemask_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}